

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O3

void skiwi::inline_fixnum_to_flonum(asmcode *code,compiler_options *param_2)

{
  uint64_t header;
  operand local_48 [4];
  operation local_38 [2];
  
  local_38[0] = SAR;
  local_48[1] = 9;
  local_48[0] = NUMBER;
  local_48[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_38,local_48 + 1,local_48,(int *)(local_48 + 2));
  local_38[0] = 0xb;
  local_48[1] = 0x43;
  local_48[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_38,local_48 + 1,local_48);
  local_38[0] = ADDSD;
  local_38[1] = 0x1000000;
  local_48[1] = 0x40;
  local_48[0] = RBX;
  local_48[2] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_48 + 1,local_48,local_48 + 2);
  local_48[1] = 0x49;
  local_48[0] = RBX;
  local_48[2] = 0x39;
  local_48[3] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_48 + 1,local_48,local_48 + 2,(int *)(local_48 + 3));
  local_48[1] = 0x40;
  local_48[0] = RAX;
  local_48[2] = 0x39;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            (code,local_48 + 1,local_48,local_48 + 2,(unsigned_long *)local_38);
  local_48[1] = 0x40;
  local_48[0] = MEM_RBP;
  local_48[2] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_48 + 1,local_48,local_48 + 2);
  local_48[1] = 0x41;
  local_48[0] = MEM_RBP;
  local_48[2] = 8;
  local_48[3] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_48 + 1,local_48,(int *)(local_48 + 2),local_48 + 3);
  local_48[1] = 0;
  local_48[0] = RBP;
  local_48[2] = 0x39;
  local_48[3] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_48 + 1,local_48,local_48 + 2,(int *)(local_48 + 3));
  local_48[1] = 0x40;
  local_48[0] = RAX;
  local_48[2] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_48 + 1,local_48,local_48 + 2);
  return;
}

Assistant:

void inline_fixnum_to_flonum(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::SAR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 1);
  code.add(ASM::asmcode::CVTSI2SD, ASM::asmcode::XMM0, ASM::asmcode::RAX);
  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RBX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, header);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::MOVQ, MEM_ALLOC, CELLS(1), ASM::asmcode::XMM0);
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::RBX);
  }